

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O3

translation_t *
opengv::absolute_pose::p2p
          (translation_t *__return_storage_ptr__,AbsoluteAdapterBase *adapter,size_t index0,
          size_t index1)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double *pdVar11;
  long lVar12;
  ActualDstType actualDst;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined8 uVar40;
  undefined1 auVar39 [16];
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  rotation_t N;
  Vector3d e1;
  Vector3d temp2;
  Matrix3d Q;
  double local_238;
  double dStack_220;
  double local_208 [6];
  double local_1d8 [4];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  double local_168;
  double dStack_160;
  double dStack_158;
  double local_148 [6];
  double adStack_118 [4];
  double local_f8;
  double dStack_f0;
  double local_e8;
  undefined1 local_e0 [16];
  double local_d0;
  undefined1 local_c8 [16];
  double local_b8;
  double local_90;
  ulong uStack_88;
  double local_80;
  double local_78;
  double local_60;
  double local_48;
  double dStack_40;
  double dStack_38;
  undefined1 auVar23 [64];
  undefined1 extraout_var [56];
  
  (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_168);
  (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_48,adapter,index1);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = local_168;
  auVar42._8_8_ = dStack_158;
  auVar42._0_8_ = dStack_158;
  auVar22._8_8_ = dStack_38;
  auVar22._0_8_ = dStack_40;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_48;
  auVar34._8_8_ = dStack_38;
  auVar34._0_8_ = dStack_38;
  local_188._8_8_ = dStack_158;
  local_188._0_8_ = dStack_160;
  auVar13 = vunpcklpd_avx(auVar42,auVar43);
  auVar4 = vunpcklpd_avx(auVar34,auVar16);
  auVar28._0_8_ = dStack_40 * auVar13._0_8_;
  auVar28._8_8_ = dStack_38 * auVar13._8_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_48 * dStack_160;
  auVar22 = vfmsub231sd_fma(auVar17,auVar43,auVar22);
  auVar4 = vfmsub213pd_fma(auVar4,local_188,auVar28);
  dVar15 = auVar22._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar15 * dVar15 + auVar4._0_8_ * auVar4._0_8_ + auVar4._8_8_ * auVar4._8_8_;
  auVar13 = vsqrtpd_avx(auVar24);
  dVar47 = auVar13._0_8_;
  auVar29._8_8_ = dVar47;
  auVar29._0_8_ = dVar47;
  auVar18._0_8_ = dVar15 / dVar47;
  auVar18._8_8_ = auVar22._8_8_;
  auVar13 = vdivpd_avx(auVar4,auVar29);
  local_178 = vshufpd_avx(auVar13,auVar13,1);
  local_48 = auVar13._0_8_;
  dVar15 = local_48;
  dStack_40 = auVar13._8_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dStack_160 * auVar18._0_8_;
  local_198 = vfmsub231sd_fma(auVar35,local_178,auVar42);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dStack_158 * local_48;
  local_1b8 = vfmsub231sd_fma(auVar36,auVar18,auVar43);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_168 * local_178._0_8_;
  local_1a8 = vfmsub231sd_fma(auVar19,auVar13,local_188);
  dStack_38 = auVar18._0_8_;
  (*adapter->_vptr_AbsoluteAdapterBase[6])(&local_f8,adapter,index1);
  (*adapter->_vptr_AbsoluteAdapterBase[6])(local_208,adapter,index0);
  auVar4._8_8_ = dStack_f0;
  auVar4._0_8_ = local_f8;
  auVar13._8_8_ = local_208[1];
  auVar13._0_8_ = local_208[0];
  auVar4 = vsubpd_avx(auVar4,auVar13);
  local_208[2] = local_e8 - local_208[2];
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       local_208[2] * local_208[2] + auVar4._0_8_ * auVar4._0_8_ + auVar4._8_8_ * auVar4._8_8_;
  auVar13 = vsqrtpd_avx(auVar30);
  dVar47 = auVar13._0_8_;
  auVar37._8_8_ = dVar47;
  auVar37._0_8_ = dVar47;
  auVar25._0_8_ = local_208[2] / dVar47;
  auVar25._8_8_ = 0;
  auVar31._8_8_ = 0x7fffffffffffffff;
  auVar31._0_8_ = 0x7fffffffffffffff;
  auVar22 = vdivpd_avx(auVar4,auVar37);
  auVar13 = vandpd_avx(auVar25,auVar31);
  auVar4 = vandpd_avx(auVar22,auVar31);
  auVar16 = vshufpd_avx(auVar22,auVar22,1);
  auVar17 = vshufps_avx(auVar4,auVar4,0x4e);
  dVar41 = auVar4._0_8_;
  dVar47 = auVar17._0_8_;
  if ((dVar41 <= dVar47) || (dVar41 <= auVar13._0_8_)) {
    if ((dVar47 <= dVar41) || (dVar47 <= auVar13._0_8_)) {
      auVar8._8_8_ = 0x8000000000000000;
      auVar8._0_8_ = 0x8000000000000000;
      auVar13 = vxorpd_avx512vl(auVar22,auVar8);
      auVar44 = ZEXT816(0x3ff0000000000000);
      dVar47 = auVar13._0_8_ / auVar25._0_8_;
      uVar40 = auVar13._8_8_;
    }
    else {
      auVar7._8_8_ = 0x8000000000000000;
      auVar7._0_8_ = 0x8000000000000000;
      auVar13 = vxorpd_avx512vl(auVar25,auVar7);
      dVar47 = 1.0;
      uVar40 = 0;
      auVar38._0_8_ = auVar13._0_8_ / auVar16._0_8_;
      auVar38._8_8_ = auVar13._8_8_;
      auVar44 = vunpcklpd_avx(ZEXT816(0) << 0x40,auVar38);
    }
  }
  else {
    auVar6._8_8_ = 0x8000000000000000;
    auVar6._0_8_ = 0x8000000000000000;
    auVar13 = vxorpd_avx512vl(auVar16,auVar6);
    dVar47 = 0.0;
    uVar40 = 0;
    auVar44._8_8_ = 0x3ff0000000000000;
    auVar44._0_8_ = auVar13._0_8_ / auVar22._0_8_;
  }
  local_208[0] = (double)vmovlpd_avx(auVar22);
  local_1d8[0] = auVar25._0_8_;
  lVar12 = 0;
  auVar17 = vunpcklpd_avx(auVar43,local_198);
  auVar19 = vunpcklpd_avx(local_188,local_1b8);
  auVar24 = vunpcklpd_avx(auVar42,local_1a8);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar47 * dVar47 + auVar44._0_8_ * auVar44._0_8_ + auVar44._8_8_ * auVar44._8_8_;
  auVar13 = vsqrtpd_avx(auVar50);
  dVar41 = auVar13._0_8_;
  auVar53._8_8_ = dVar41;
  auVar53._0_8_ = dVar41;
  auVar13 = vdivpd_avx(auVar44,auVar53);
  auVar54._0_8_ = dVar47 / dVar41;
  auVar54._8_8_ = uVar40;
  auVar4 = vshufpd_avx(auVar13,auVar13,1);
  dVar47 = auVar13._0_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = auVar54._0_8_ * auVar16._0_8_;
  auVar28 = vfmsub231sd_fma(auVar45,auVar4,auVar25);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar47 * auVar25._0_8_;
  auVar25 = vfmsub231sd_fma(auVar51,auVar54,auVar22);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = auVar22._0_8_ * auVar4._0_8_;
  auVar4 = vfmsub231sd_fma(auVar48,auVar13,auVar16);
  local_208[1] = auVar28._0_8_;
  local_208[4] = auVar25._0_8_;
  local_1d8[1] = auVar4._0_8_;
  local_208[2] = dVar47;
  local_208[3] = auVar22._8_8_;
  local_208[5] = (double)vmovhpd_avx(auVar13);
  local_1d8[2] = auVar54._0_8_;
  adStack_118[2] =
       (adapter->_R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[8];
  pdVar11 = &local_e8;
  local_148[0] = (adapter->_R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[0];
  local_148[1] = (adapter->_R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[1];
  local_148[2] = (adapter->_R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[2];
  local_148[3] = (adapter->_R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[3];
  local_148[4] = (adapter->_R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[4];
  local_148[5] = (adapter->_R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[5];
  adStack_118[0] =
       (adapter->_R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[6];
  adStack_118[1] =
       (adapter->_R).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[7];
  do {
    dVar41 = local_148[lVar12];
    dVar1 = local_148[lVar12 + 3];
    auVar32._8_8_ = dVar1;
    auVar32._0_8_ = dVar1;
    dVar2 = local_148[lVar12 + 6];
    auVar46._8_8_ = dVar2;
    auVar46._0_8_ = dVar2;
    lVar12 = lVar12 + 1;
    auVar26._0_8_ = auVar17._0_8_ * dVar41;
    auVar26._8_8_ = auVar17._8_8_ * dVar41;
    auVar4 = vfmadd231pd_fma(auVar26,auVar19,auVar32);
    auVar4 = vfmadd231pd_fma(auVar4,auVar24,auVar46);
    *(undefined1 (*) [16])(pdVar11 + -2) = auVar4;
    *pdVar11 = dVar15 * dVar41 + (double)local_178._0_8_ * dVar1 + auVar18._0_8_ * dVar2;
    pdVar11 = pdVar11 + 3;
  } while (lVar12 != 3);
  pdVar11 = &local_80;
  lVar12 = 0;
  do {
    dVar15 = local_208[lVar12];
    dVar41 = local_208[lVar12 + 3];
    auVar52._8_8_ = dVar41;
    auVar52._0_8_ = dVar41;
    dVar1 = local_208[lVar12 + 6];
    auVar55._8_8_ = dVar1;
    auVar55._0_8_ = dVar1;
    lVar12 = lVar12 + 1;
    auVar49._0_8_ = local_f8 * dVar15;
    auVar49._8_8_ = dStack_f0 * dVar15;
    auVar4 = vfmadd231pd_fma(auVar49,local_e0,auVar52);
    auVar4 = vfmadd231pd_fma(auVar4,local_c8,auVar55);
    *(undefined1 (*) [16])(pdVar11 + -2) = auVar4;
    *pdVar11 = local_e8 * dVar15 + dVar1 * local_b8 + dVar41 * local_d0;
    pdVar11 = pdVar11 + 3;
  } while (lVar12 != 3);
  (*adapter->_vptr_AbsoluteAdapterBase[6])(&local_f8,adapter,index1);
  (*adapter->_vptr_AbsoluteAdapterBase[6])(local_148,adapter,index0);
  auVar10._8_8_ = dStack_f0;
  auVar10._0_8_ = local_f8;
  auVar9._8_8_ = local_148[1];
  auVar9._0_8_ = local_148[0];
  auVar4 = vsubpd_avx(auVar10,auVar9);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (local_e8 - local_148[2]) * (local_e8 - local_148[2]) +
       auVar4._0_8_ * auVar4._0_8_ + auVar4._8_8_ * auVar4._8_8_;
  auVar4 = vsqrtsd_avx(auVar20,auVar20);
  (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_f8,adapter,index1);
  dVar15 = local_168 * local_f8 + dStack_160 * dStack_f0 + dStack_158 * local_e8;
  dVar41 = 1.0 / (1.0 - dVar15 * dVar15) + -1.0;
  if (dVar41 < 0.0) {
    auVar23._0_8_ = sqrt(dVar41);
    auVar23._8_56_ = extraout_var;
    auVar22 = auVar23._0_16_;
  }
  else {
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar41;
    auVar22 = vsqrtsd_avx(auVar21,auVar21);
  }
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar15;
  uVar40 = vcmpsd_avx512f(auVar39,ZEXT816(0) << 0x40,1);
  bVar5 = (bool)((byte)uVar40 & 1);
  local_238 = auVar4._0_8_;
  auVar14._0_8_ =
       (ulong)bVar5 * (auVar22._0_8_ ^ 0x8000000000000000) + (ulong)!bVar5 * auVar22._0_8_;
  auVar14._8_8_ = auVar22._8_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_90;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uStack_88;
  auVar4 = vfmsub132sd_fma(auVar14,auVar33,auVar3);
  dVar15 = auVar4._0_8_ * -local_238;
  dVar41 = dVar15 * local_60;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = local_90 * dVar15;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] = dVar15 * local_78;
  (*adapter->_vptr_AbsoluteAdapterBase[6])(local_148,adapter,index0);
  dVar15 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
           m_storage.m_data.array[0];
  dVar1 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[1];
  dStack_220 = auVar13._8_8_;
  auVar27._0_8_ = dVar15 * local_208[0] + dVar1 * local_208[1] + dVar41 * dVar47 + local_148[0];
  auVar27._8_8_ = dVar15 * local_208[3] + dVar1 * local_208[4] + dVar41 * dStack_220 + local_148[1];
  local_148[2] = dVar41 * auVar54._0_8_ + dVar15 * local_1d8[0] + dVar1 * local_1d8[1] +
                 local_148[2];
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
   m_data.array = auVar27;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = local_148[2];
  if (((NAN(auVar27._0_8_)) || (auVar13 = vshufpd_avx(auVar27,auVar27,1), NAN(auVar13._0_8_))) ||
     (NAN(local_148[2]))) {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[2] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[0] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[1] = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

opengv::translation_t
opengv::absolute_pose::p2p(
    const AbsoluteAdapterBase & adapter,
    size_t index0,
    size_t index1)
{
  Eigen::Vector3d e1 = adapter.getBearingVector(index0);
  Eigen::Vector3d e3 = adapter.getBearingVector(index1);
  e3 = e1.cross(e3);
  e3 = e3/e3.norm();
  Eigen::Vector3d e2 = e3.cross(e1);

  rotation_t T;
  T.row(0) = e1.transpose();
  T.row(1) = e2.transpose();
  T.row(2) = e3.transpose();

  Eigen::Vector3d n1 = adapter.getPoint(index1) - adapter.getPoint(index0);
  n1 = n1/n1.norm();
  Eigen::Vector3d n3;
  if( (fabs(n1[0]) > fabs(n1[1])) && (fabs(n1[0]) > fabs(n1[2])) )
  {
    n3[1] = 1.0;
    n3[2] = 0.0;
    n3[0] = -n1[1]/n1[0];
  }
  else
  {
    if( (fabs(n1[1]) > fabs(n1[0])) && (fabs(n1[1]) > fabs(n1[2])) )
    {
      n3[2] = 1.0;
      n3[0] = 0.0;
      n3[1] = -n1[2]/n1[1];
    }
    else
    {
      n3[0] = 1.0;
      n3[1] = 0.0;
      n3[2] = -n1[0]/n1[2];
    }
  }
  n3 = n3 / n3.norm();
  Eigen::Vector3d n2 = n3.cross(n1);

  rotation_t N;
  N.row(0) = n1.transpose();
  N.row(1) = n2.transpose();
  N.row(2) = n3.transpose();

  Eigen::Matrix3d Q = T * adapter.getR().transpose() * N.transpose();
  Eigen::Vector3d temp1 = adapter.getPoint(index1) - adapter.getPoint(index0);
  double d_12 = temp1.norm();

  Eigen::Vector3d temp2 = adapter.getBearingVector(index1);
  double cos_beta = e1.dot(temp2);
  double b = 1/( 1 - pow( cos_beta, 2 ) ) - 1;

  if( cos_beta < 0 )
    b = -sqrt(b);
  else
    b = sqrt(b);

  double temp3 = d_12 * ( Q(1,0) * b - Q(0,0) );

  translation_t solution = -temp3 * Q.row(0).transpose();
  solution = adapter.getPoint(index0) + N.transpose()*solution;

  if(
    solution(0,0) != solution(0,0) ||
    solution(1,0) != solution(1,0) ||
    solution(2,0) != solution(2,0) )
    solution = Eigen::Vector3d::Zero();

  return solution;
}